

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_table_function.cpp
# Opt level: O1

void __thiscall
duckdb::Binder::BindTableInTableOutFunction
          (Binder *this,
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
          *expressions,
          unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>,_true>
          *subquery)

{
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var1;
  _Head_base<0UL,_duckdb::BoundSubqueryRef_*,_false> _Var2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  SelectNode *this_00;
  pointer pSVar8;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var9;
  Binder *pBVar10;
  _Head_base<0UL,_duckdb::BoundSubqueryRef_*,_false> _Var11;
  pointer pBVar12;
  type other;
  templated_unique_single_t select_node;
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> subquery_node;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_50;
  undefined1 local_48 [16];
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  CreateBinder((Binder *)&stack0xffffffffffffffc8,this->context,
               (optional_ptr<duckdb::Binder,_true>)this,REGULAR_BINDER);
  local_48._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (SelectNode *)operator_new(0xf0);
  SelectNode::SelectNode(this_00);
  local_50._M_head_impl = this_00;
  pSVar8 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)&local_50);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::_M_move_assign(&(pSVar8->select_list).
                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ,expressions);
  _Var9._M_head_impl = (TableRef *)operator_new(0x68);
  (_Var9._M_head_impl)->type = EMPTY_FROM;
  ((_Var9._M_head_impl)->alias)._M_dataplus = (_Alloc_hider)&((_Var9._M_head_impl)->alias).field_2;
  ((_Var9._M_head_impl)->alias)._M_string_length = 0;
  ((_Var9._M_head_impl)->alias).field_2._M_local_buf[0] = '\0';
  ((_Var9._M_head_impl)->sample).
  super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> =
       (unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>)0x0;
  ((_Var9._M_head_impl)->query_location).index = 0xffffffffffffffff;
  *(undefined8 *)&((_Var9._M_head_impl)->external_dependency).internal = 0;
  ((_Var9._M_head_impl)->external_dependency).internal.
  super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)
   &((_Var9._M_head_impl)->column_name_alias).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       = 0;
  ((_Var9._M_head_impl)->column_name_alias).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((_Var9._M_head_impl)->column_name_alias).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (_Var9._M_head_impl)->_vptr_TableRef = (_func_int **)&PTR__TableRef_0247ec60;
  pSVar8 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)&local_50);
  _Var1._M_head_impl =
       (pSVar8->from_table).
       super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (pSVar8->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
  _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = _Var9._M_head_impl;
  if (_Var1._M_head_impl != (TableRef *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_TableRef + 8))();
  }
  uVar3 = local_48._8_8_;
  local_48._8_8_ = local_50._M_head_impl;
  local_50._M_head_impl = (SelectNode *)0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(*(_func_int ***)uVar3)[1])();
  }
  pBVar10 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)&stack0xffffffffffffffc8);
  pBVar10->can_contain_nulls = true;
  pBVar10 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)&stack0xffffffffffffffc8);
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*
            ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
             (local_48 + 8));
  BindNode((Binder *)local_48,(QueryNode *)pBVar10);
  _Var11._M_head_impl = (BoundSubqueryRef *)operator_new(0x30);
  uVar3 = local_48._0_8_;
  uVar4 = local_38;
  uVar5 = uStack_34;
  uVar6 = uStack_30;
  uVar7 = uStack_2c;
  _local_38 = (element_type *)0x0;
  _uStack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48._0_8_ = (element_type *)0x0;
  ((_Var11._M_head_impl)->super_BoundTableRef).type = SUBQUERY;
  ((_Var11._M_head_impl)->super_BoundTableRef).sample.
  super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> =
       (unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>)0x0;
  ((_Var11._M_head_impl)->super_BoundTableRef)._vptr_BoundTableRef = &PTR__BoundSubqueryRef_02479530
  ;
  *(undefined4 *)&((_Var11._M_head_impl)->binder).internal = uVar4;
  *(undefined4 *)
   ((long)&((_Var11._M_head_impl)->binder).internal.
           super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = uVar5;
  *(undefined4 *)
   &((_Var11._M_head_impl)->binder).internal.
    super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = uVar6;
  *(undefined4 *)
   ((long)&((_Var11._M_head_impl)->binder).internal.
           super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 4) =
       uVar7;
  ((_Var11._M_head_impl)->subquery).
  super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_> =
       (unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>)uVar3;
  _Var2._M_head_impl =
       (subquery->
       super_unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundSubqueryRef_*,_std::default_delete<duckdb::BoundSubqueryRef>_>
       .super__Head_base<0UL,_duckdb::BoundSubqueryRef_*,_false>._M_head_impl;
  (subquery->
  super_unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>_>)._M_t.
  super___uniq_ptr_impl<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::BoundSubqueryRef_*,_std::default_delete<duckdb::BoundSubqueryRef>_>
  .super__Head_base<0UL,_duckdb::BoundSubqueryRef_*,_false>._M_head_impl = _Var11._M_head_impl;
  if (_Var2._M_head_impl != (BoundSubqueryRef *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BoundTableRef + 8))();
  }
  pBVar12 = unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>,_true>
            ::operator->(subquery);
  other = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar12->binder);
  MoveCorrelatedExpressions(this,other);
  if ((element_type *)local_48._0_8_ != (element_type *)0x0) {
    (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_48._0_8_)->__weak_this_).internal
                .super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
  }
  if (local_50._M_head_impl != (SelectNode *)0x0) {
    (*((local_50._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
  }
  if ((SelectNode *)local_48._8_8_ != (SelectNode *)0x0) {
    (*((QueryNode *)local_48._8_8_)->_vptr_QueryNode[1])();
  }
  if (_uStack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_uStack_30);
  }
  return;
}

Assistant:

void Binder::BindTableInTableOutFunction(vector<unique_ptr<ParsedExpression>> &expressions,
                                         unique_ptr<BoundSubqueryRef> &subquery) {
	auto binder = Binder::CreateBinder(this->context, this);
	unique_ptr<QueryNode> subquery_node;
	// generate a subquery and bind that (i.e. UNNEST([1,2,3]) becomes UNNEST((SELECT [1,2,3]))
	auto select_node = make_uniq<SelectNode>();
	select_node->select_list = std::move(expressions);
	select_node->from_table = make_uniq<EmptyTableRef>();
	subquery_node = std::move(select_node);
	binder->can_contain_nulls = true;
	auto node = binder->BindNode(*subquery_node);
	subquery = make_uniq<BoundSubqueryRef>(std::move(binder), std::move(node));
	MoveCorrelatedExpressions(*subquery->binder);
}